

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set
          (ArenaStringPtr *this,string *default_value,ConstStringParam value,Arena *arena)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  string *psVar2;
  ulong uVar3;
  ArenaImpl *in_RCX;
  string *in_RDX;
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  size_t n;
  string *in_stack_ffffffffffffff08;
  ArenaStringPtr *in_stack_ffffffffffffff10;
  type_info *in_stack_ffffffffffffff18;
  ArenaImpl *in_stack_ffffffffffffff20;
  _func_void_void_ptr *in_stack_ffffffffffffff30;
  ArenaStringPtr *in_stack_ffffffffffffffc0;
  
  bVar1 = IsDefault(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (bVar1) {
    if (in_RCX == (ArenaImpl *)0x0) {
      p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
      std::__cxx11::string::string((string *)p,in_RDX);
    }
    else {
      AlignUpTo8(0x20);
      ArenaImpl::RecordAlloc
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (size_t)in_stack_ffffffffffffff10);
      p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ArenaImpl::AllocateAlignedAndAddCleanup(in_RCX,(size_t)in_RDI,in_stack_ffffffffffffff30);
      std::__cxx11::string::string((string *)p,in_RDX);
    }
    TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
              (in_RDI,p);
  }
  else {
    psVar2 = UnsafeMutablePointer_abi_cxx11_(in_stack_ffffffffffffffc0);
    uVar3 = std::__cxx11::string::data();
    std::__cxx11::string::length();
    std::__cxx11::string::assign((char *)psVar2,uVar3);
  }
  return;
}

Assistant:

void ArenaStringPtr::Set(const std::string* default_value,
                         ConstStringParam value, ::google::protobuf::Arena* arena) {
  if (IsDefault(default_value)) {
    tagged_ptr_.Set(Arena::Create<std::string>(arena, value));
  } else {
    UnsafeMutablePointer()->assign(value.data(), value.length());
  }
}